

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlReportText.cpp
# Opt level: O0

string * __thiscall
oout::FmtJunitXml::suite
          (string *__return_storage_ptr__,FmtJunitXml *this,string *name,nanoseconds *duration,
          list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
          *results)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  element_type *peVar4;
  string local_248 [32];
  __shared_ptr_access<const_oout::Result,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_228;
  shared_ptr<const_oout::Result> *r;
  const_iterator __end2;
  const_iterator __begin2;
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  *__range2;
  ostringstream out;
  duration<float,_std::ratio<1L,_1L>_> local_90;
  rep_conflict local_8c;
  undefined1 local_88 [4];
  rep_conflict time;
  size_t local_78;
  size_t count_error;
  size_t local_60;
  size_t count_failure;
  CountTest local_48;
  size_t local_38;
  size_t count_test;
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  *results_local;
  nanoseconds *duration_local;
  string *name_local;
  FmtJunitXml *this_local;
  
  count_test = (size_t)results;
  results_local =
       (list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
        *)duration;
  duration_local = (nanoseconds *)name;
  name_local = (string *)this;
  this_local = (FmtJunitXml *)__return_storage_ptr__;
  CountTest::CountTest(&local_48,results);
  sVar2 = CountTest::count(&local_48);
  CountTest::~CountTest(&local_48);
  local_38 = sVar2;
  CountFailure::CountFailure
            ((CountFailure *)&count_error,
             (list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
              *)count_test);
  sVar2 = CountFailure::count((CountFailure *)&count_error);
  CountFailure::~CountFailure((CountFailure *)&count_error);
  local_60 = sVar2;
  CountError::CountError
            ((CountError *)local_88,
             (list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
              *)count_test);
  sVar2 = CountError::count((CountError *)local_88);
  CountError::~CountError((CountError *)local_88);
  local_78 = sVar2;
  local_90.__r = (rep_conflict)
                 std::chrono::
                 duration_cast<std::chrono::duration<float,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                           ((duration<long,_std::ratio<1L,_1000000000L>_> *)results_local);
  local_8c = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count(&local_90);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2);
  poVar3 = std::operator<<((ostream *)&__range2,"<testsuite ");
  poVar3 = std::operator<<(poVar3,"name=\'");
  poVar3 = std::operator<<(poVar3,(string *)duration_local);
  poVar3 = std::operator<<(poVar3,"\' ");
  poVar3 = std::operator<<(poVar3,"tests=\'");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_38);
  poVar3 = std::operator<<(poVar3,"\' ");
  poVar3 = std::operator<<(poVar3,"failures=\'");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_60);
  poVar3 = std::operator<<(poVar3,"\' ");
  poVar3 = std::operator<<(poVar3,"errors=\'");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_78);
  poVar3 = std::operator<<(poVar3,"\' ");
  poVar3 = std::operator<<(poVar3,"time=\'");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_8c);
  poVar3 = std::operator<<(poVar3,"\'>");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  sVar2 = count_test;
  __end2 = std::__cxx11::
           list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
           ::begin((list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
                    *)count_test);
  r = (shared_ptr<const_oout::Result> *)
      std::__cxx11::
      list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
      ::end((list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
             *)sVar2);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&r);
    if (!bVar1) break;
    local_228 = (__shared_ptr_access<const_oout::Result,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )std::_List_const_iterator<std::shared_ptr<const_oout::Result>_>::operator*(&__end2)
    ;
    peVar4 = std::__shared_ptr_access<const_oout::Result,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_228);
    (*peVar4->_vptr_Result[2])(local_248,peVar4,this);
    std::operator<<((ostream *)&__range2,local_248);
    std::__cxx11::string::~string(local_248);
    std::_List_const_iterator<std::shared_ptr<const_oout::Result>_>::operator++(&__end2);
  }
  poVar3 = std::operator<<((ostream *)&__range2,"</testsuite>");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

string suite(
		const string &name,
		const chrono::nanoseconds &duration,
		const list<shared_ptr<const Result>> &results
	) const override
	{
		const auto count_test = CountTest(results).count();
		const auto count_failure = CountFailure(results).count();
		const auto count_error = CountError(results).count();
		const auto time = chrono::duration_cast<chrono::duration<float>>(duration).count();

		ostringstream out;
		out << "<testsuite "
		    << "name='" << name << "' "
		    << "tests='" << count_test << "' "
		    << "failures='" << count_failure << "' "
		    << "errors='" << count_error << "' "
		    << "time='" << time << "'>"
		    << endl;

		for (const auto &r : results) {
			out << r->print(*this);
		}

		out << "</testsuite>" << endl;
		return out.str();
	}